

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O2

bool __thiscall
tinyusdz::BlendShape::add_inbetweenBlendShape(BlendShape *this,double weight,Attribute *attr)

{
  bool bVar1;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string attr_name;
  allocator local_629;
  double local_628;
  string local_620;
  Property local_600;
  
  bVar1 = false;
  if (((attr->_name)._M_string_length != 0) && (attr->_variability != Uniform)) {
    local_628 = weight;
    bVar1 = Attribute::is_value(attr);
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&local_600,"{}:{}",&local_629);
      fmt::format<char_const*,std::__cxx11::string>
                (&local_620,(fmt *)&local_600,(string *)&kInbetweensNamespace,(char **)attr,in_R8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_assign((string *)attr);
      local_600._attrib._name._M_dataplus._M_p._0_1_ = 1;
      local_600._attrib._name._M_string_length = (size_type)local_628;
      nonstd::optional_lite::optional<double>::operator=
                (&(attr->_metas).weight,(optional<double> *)&local_600);
      Property::Property(&local_600,attr,false);
      this_00 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::operator[](&this->props,&local_620);
      Property::operator=(this_00,&local_600);
      Property::~Property(&local_600);
      ::std::__cxx11::string::_M_dispose();
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool BlendShape::add_inbetweenBlendShape(const double weight, Attribute &&attr) {

  if (attr.name().empty()) {
    return false;
  }

  if (attr.is_uniform()) {
    return false;
  }

  if (!attr.is_value()) {
    return false;
  }

  std::string attr_name = fmt::format("{}:{}", kInbetweensNamespace, attr.name());
  attr.set_name(attr_name);

  attr.metas().weight = weight;

  props[attr_name] = Property(attr, /* custom */false);

  return true;
}